

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_decl.cc
# Opt level: O0

void __thiscall Decl::Decl(Decl *this,ID *id,DeclType decl_type)

{
  mapped_type *ppDVar1;
  DeclList *__s;
  char *pcVar2;
  DeclType in_EDX;
  ID *in_RSI;
  mapped_type in_RDI;
  value_type *in_stack_ffffffffffffffa8;
  FILE *__stream;
  vector<Decl_*,_std::allocator<Decl_*>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffe8;
  
  Object::Object(&in_RSI->super_Object);
  in_RDI->_vptr_Decl = (_func_int **)&PTR__Decl_00179b68;
  in_RDI->id_ = in_RSI;
  in_RDI->decl_type_ = in_EDX;
  in_RDI->attrlist_ = (AttrList *)0x0;
  ppDVar1 = std::
            map<const_ID_*,_Decl_*,_ID_ptr_cmp,_std::allocator<std::pair<const_ID_*const,_Decl_*>_>_>
            ::operator[]((map<const_ID_*,_Decl_*,_ID_ptr_cmp,_std::allocator<std::pair<const_ID_*const,_Decl_*>_>_>
                          *)in_RSI,(key_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  *ppDVar1 = in_RDI;
  if (decl_list_ == (DeclList *)0x0) {
    __s = (DeclList *)operator_new(0x18);
    memset(__s,0,0x18);
    std::vector<Decl_*,_std::allocator<Decl_*>_>::vector
              ((vector<Decl_*,_std::allocator<Decl_*>_> *)0x12d819);
    decl_list_ = __s;
  }
  std::vector<Decl_*,_std::allocator<Decl_*>_>::push_back
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((FLAGS_pac_debug & 1U) != 0) {
    __stream = _stderr;
    pcVar2 = ID::Name((ID *)0x12d88a);
    fprintf(__stream,"Finished Decl %s\n",pcVar2);
  }
  in_RDI->analyzer_context_ = (AnalyzerContextDecl *)0x0;
  return;
}

Assistant:

Decl::Decl(ID* id, DeclType decl_type) : id_(id), decl_type_(decl_type), attrlist_(nullptr)
	{
	decl_map_[id_] = this;
	if ( ! decl_list_ )
		decl_list_ = new DeclList();
	decl_list_->push_back(this);

	DEBUG_MSG("Finished Decl %s\n", id_->Name());

	analyzer_context_ = nullptr;
	}